

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

TestCaseGroup *
deqp::egl::createCaseGroup<deqp::egl::PreserveBackBufferCase>
          (EglTestContext *eglTestCtx,string *name,string *desc)

{
  TestCaseGroup *this;
  char *name_00;
  char *description;
  TestNode *node;
  ResizeParams *local_278;
  int local_19c;
  int ndx;
  TestCaseGroup *group;
  allocator<char> local_188;
  allocator<char> local_187;
  undefined1 local_186;
  allocator<char> local_185 [20];
  allocator<char> local_171;
  string *local_170;
  undefined1 local_168 [8];
  ResizeParams params [4];
  string *desc_local;
  string *name_local;
  EglTestContext *eglTestCtx_local;
  
  group._0_1_ = 1;
  local_170 = (string *)local_168;
  params[3].newSize.m_data = (int  [2])desc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"shrink",&local_171);
  local_186 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(params[0].name.field_2._M_local_buf + 8),"Shrink in both dimensions",
             local_185);
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)((long)&params[0].description.field_2 + 8),0x80,0x80);
  tcu::Vector<int,_2>::Vector(&params[0].oldSize,0x20,0x20);
  local_186 = 0;
  local_170 = (string *)&params[0].newSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&params[0].newSize,"grow",&local_187)
  ;
  group._7_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(params[1].name.field_2._M_local_buf + 8),"Grow in both dimensions",
             &local_188);
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)((long)&params[1].description.field_2 + 8),0x20,0x20);
  tcu::Vector<int,_2>::Vector(&params[1].oldSize,0x80,0x80);
  group._7_1_ = 0;
  local_170 = (string *)&params[1].newSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params[1].newSize,"stretch_width",(allocator<char> *)((long)&group + 6));
  group._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(params[2].name.field_2._M_local_buf + 8),
             "Grow horizontally, shrink vertically",(allocator<char> *)((long)&group + 5));
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)((long)&params[2].description.field_2 + 8),0x20,0x80);
  tcu::Vector<int,_2>::Vector(&params[2].oldSize,0x80,0x20);
  group._4_1_ = 0;
  local_170 = (string *)&params[2].newSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params[2].newSize,"stretch_height",(allocator<char> *)((long)&group + 3));
  group._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(params[3].name.field_2._M_local_buf + 8),
             "Grow vertically, shrink horizontally",(allocator<char> *)((long)&group + 2));
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)((long)&params[3].description.field_2 + 8),0x80,0x20);
  tcu::Vector<int,_2>::Vector(&params[3].oldSize,0x20,0x80);
  group._1_1_ = 0;
  group._0_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&group + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&group + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&group + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&group + 6));
  std::allocator<char>::~allocator(&local_188);
  std::allocator<char>::~allocator(&local_187);
  std::allocator<char>::~allocator(local_185);
  std::allocator<char>::~allocator(&local_171);
  this = (TestCaseGroup *)operator_new(0x78);
  name_00 = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  TestCaseGroup::TestCaseGroup(this,eglTestCtx,name_00,description);
  for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
    node = (TestNode *)operator_new(0x1b48);
    PreserveBackBufferCase::PreserveBackBufferCase
              ((PreserveBackBufferCase *)node,eglTestCtx,
               (ResizeParams *)&params[(long)local_19c + -1].newSize);
    tcu::TestNode::addChild((TestNode *)this,node);
  }
  local_278 = (ResizeParams *)&params[3].newSize;
  do {
    local_278 = local_278 + -1;
    ResizeParams::~ResizeParams(local_278);
  } while (local_278 != (ResizeParams *)local_168);
  return this;
}

Assistant:

TestCaseGroup* createCaseGroup(EglTestContext&	eglTestCtx,
							   const string&	name,
							   const string&	desc)
{
	const ResizeParams		params[]	=
	{
		{ "shrink",			"Shrink in both dimensions",
		  IVec2(128, 128),	IVec2(32, 32) },
		{ "grow",			"Grow in both dimensions",
		  IVec2(32, 32),	IVec2(128, 128) },
		{ "stretch_width",	"Grow horizontally, shrink vertically",
		  IVec2(32, 128),	IVec2(128, 32) },
		{ "stretch_height",	"Grow vertically, shrink horizontally",
		  IVec2(128, 32),	IVec2(32, 128) },
	};
	TestCaseGroup* const	group		=
		new TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str());

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(params); ++ndx)
		group->addChild(new Case(eglTestCtx, params[ndx]));

	return group;
}